

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O1

void __thiscall
FlowGraph::InsertCompBlockToLoopList
          (FlowGraph *this,Loop *loop,BasicBlock *compBlock,BasicBlock *targetBlock,bool postTarget)

{
  bool bVar1;
  Type *ppBVar2;
  undefined7 in_register_00000081;
  bool bVar3;
  undefined1 local_60 [8];
  EditingIterator iter;
  BasicBlock *local_40;
  BasicBlock *compBlock_local;
  
  if (loop != (Loop *)0x0) {
    compBlock_local._4_4_ = (undefined4)CONCAT71(in_register_00000081,postTarget);
    local_60 = (undefined1  [8])&loop->blockList;
    iter.super_EditingIterator.super_Iterator.current = (NodeBase *)0x0;
    bVar3 = false;
    iter.super_EditingIterator.super_Iterator.list =
         (SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *)local_60;
    iter.super_EditingIterator.last = (NodeBase *)this;
    local_40 = compBlock;
    do {
      bVar1 = SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::Next
                        ((EditingIterator *)local_60);
      if (!bVar1) goto LAB_0041e661;
      ppBVar2 = SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                          ((Iterator *)local_60);
    } while (*ppBVar2 != targetBlock || ((*ppBVar2)->field_0x18 & 1) != 0);
    bVar3 = true;
LAB_0041e661:
    bVar1 = SUB41(compBlock_local._4_4_,0);
    if (bVar3) {
      if (bVar1 != false) {
        SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::Next
                  ((EditingIterator *)local_60);
      }
      SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::InsertBefore
                ((EditingIterator *)local_60,
                 (ArenaAllocator *)
                 (((SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *)
                  ((long)local_60 + 0x10))->super_SListNodeBase<Memory::ArenaAllocator>).next,
                 &local_40);
    }
    InsertCompBlockToLoopList
              ((FlowGraph *)iter.super_EditingIterator.last,loop->parent,local_40,targetBlock,bVar1)
    ;
  }
  return;
}

Assistant:

void
FlowGraph::InsertCompBlockToLoopList(Loop *loop, BasicBlock* compBlock, BasicBlock* targetBlock, bool postTarget)
{
    if (loop)
    {
        bool found = false;
        FOREACH_BLOCK_IN_LOOP_EDITING(loopBlock, loop, iter)
        {
            if (loopBlock == targetBlock)
            {
                found = true;
                break;
            }
        } NEXT_BLOCK_IN_LOOP_EDITING;
        if (found)
        {
            if (postTarget)
            {
                iter.Next();
            }
            iter.InsertBefore(compBlock);
        }
        InsertCompBlockToLoopList(loop->parent, compBlock, targetBlock, postTarget);
    }
}